

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_48(QPDF *pdf,char *arg2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  reference pbVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_19b0;
  QPDFObjectHandle local_17d0;
  allocator<char> local_17b9;
  string local_17b8 [32];
  iterator local_1798;
  allocator<char> local_1749;
  string local_1748 [32];
  QPDFObjectHandle local_1728;
  QPDFObjectHandle local_1718;
  QPDFNameTreeObjectHelper local_1708 [8];
  QPDFNameTreeObjectHelper bad6;
  allocator<char> local_16c9;
  string local_16c8 [32];
  iterator local_16a8;
  allocator<char> local_1659;
  string local_1658 [32];
  QPDFObjectHandle local_1638;
  QPDFObjectHandle local_1628;
  QPDFNameTreeObjectHelper local_1618 [8];
  QPDFNameTreeObjectHelper bad5;
  T *i_4;
  iterator __end1_6;
  iterator __begin1_6;
  QPDFNameTreeObjectHelper *__range1_6;
  string local_1538 [32];
  iterator local_1518;
  allocator<char> local_14c9;
  string local_14c8 [32];
  QPDFObjectHandle local_14a8;
  QPDFObjectHandle local_1498;
  QPDFNameTreeObjectHelper local_1488 [8];
  QPDFNameTreeObjectHelper bad4;
  iterator local_1450;
  allocator<char> local_1401;
  string local_1400 [32];
  iterator local_13e0;
  allocator<char> local_1391;
  string local_1390 [32];
  QPDFObjectHandle local_1370;
  QPDFObjectHandle local_1360;
  QPDFNameTreeObjectHelper local_1350 [8];
  QPDFNameTreeObjectHelper bad3;
  T *i_3;
  iterator __end1_5;
  iterator __begin1_5;
  QPDFNameTreeObjectHelper *__range1_5;
  string local_1270 [32];
  iterator local_1250;
  allocator<char> local_1201;
  string local_1200 [32];
  QPDFObjectHandle local_11e0;
  QPDFObjectHandle local_11d0;
  QPDFNameTreeObjectHelper local_11c0 [8];
  QPDFNameTreeObjectHelper bad2;
  T *i_2;
  iterator __end1_4;
  iterator __begin1_4;
  QPDFNameTreeObjectHelper *__range1_4;
  string local_10e0 [32];
  iterator local_10c0;
  allocator<char> local_1071;
  string local_1070 [32];
  QPDFObjectHandle local_1050;
  QPDFObjectHandle local_1040;
  QPDFNameTreeObjectHelper local_1030 [8];
  QPDFNameTreeObjectHelper bad1;
  iterator local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  iterator local_f90;
  iterator local_f48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  allocator<char> local_eb9;
  string local_eb8 [32];
  QPDFObjectHandle local_e98;
  allocator<char> local_e81;
  string local_e80 [32];
  iterator local_e60;
  iterator local_e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  allocator<char> local_d89;
  string local_d88 [32];
  QPDFObjectHandle local_d68;
  allocator<char> local_d51;
  string local_d50 [32];
  iterator local_d30;
  iterator local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  iterator local_c80;
  iterator local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  allocator<char> local_bc9;
  string local_bc8 [32];
  QPDFObjectHandle local_ba8;
  allocator<char> local_b91;
  string local_b90 [32];
  undefined1 local_b70 [8];
  iterator i_1;
  iterator local_ae0;
  iterator local_a98;
  iterator local_a50;
  QPDFObjectHandle local_a08;
  QPDFObjectHandle local_9f8;
  QPDFNameTreeObjectHelper local_9e8 [8];
  QPDFNameTreeObjectHelper empty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  string local_960 [32];
  iterator local_940;
  size_type local_938;
  undefined1 local_930 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empties;
  T *i;
  iterator __end1_2;
  iterator __begin1_2;
  QPDFNameTreeObjectHelper *__range1_2;
  string local_850 [32];
  QPDFObjectHandle local_830;
  allocator<char> local_819;
  string local_818 [39];
  allocator<char> local_7f1;
  string local_7f0 [32];
  QPDFObjectHandle local_7d0;
  allocator<char> local_7b9;
  string local_7b8 [32];
  iterator local_798;
  undefined1 local_750 [8];
  iterator iter2;
  QPDFNameTreeObjectHelper new2;
  iterator local_6d0;
  iterator local_688;
  allocator<char> local_639;
  string local_638 [32];
  QPDFObjectHandle local_618;
  allocator<char> local_601;
  string local_600 [32];
  iterator local_5e0;
  iterator local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  T *iter1_val;
  string local_540 [32];
  QPDFObjectHandle local_520;
  allocator<char> local_509;
  string local_508 [32];
  iterator local_4e8;
  iterator local_4a0;
  iterator local_458;
  iterator local_410;
  undefined1 local_3c8 [8];
  iterator iter1;
  QPDFNameTreeObjectHelper new1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [8];
  iterator last;
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [32];
  undefined1 local_270 [8];
  QPDFObjectHandle oh;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [32];
  string local_1e8 [32];
  reference local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ntoh_map;
  T *iter;
  iterator __end1;
  iterator __begin1;
  QPDFNameTreeObjectHelper *__range1;
  QPDFNameTreeObjectHelper local_a8 [8];
  QPDFNameTreeObjectHelper ntoh;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle qtest;
  char *arg2_local;
  QPDF *pdf_local;
  
  qtest.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QTest",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1,(QPDFObjectHandle *)local_28);
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            (local_a8,(QPDFObjectHandle *)&__range1,pdf,true);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                      ((iterator *)
                       &__end1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&iter);
    if (!bVar1) break;
    psVar6 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&std::cout,psVar6);
    poVar4 = std::operator<<(poVar4," -> ");
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)
                                    &ntoh_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)&ntoh_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&iter);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::getAsMap_abi_cxx11_();
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)&__range1_1);
  iter_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     *)&__range1_1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&iter_1);
    if (!bVar1) break;
    local_1c8 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                ::operator*(&__end1_1);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_1c8);
    poVar4 = std::operator<<(poVar4," -> ");
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_1e8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"11 elephant",&local_209);
  bVar2 = QPDFNameTreeObjectHelper::hasName((string *)local_a8);
  if ((bVar2 & 1) == 0) {
    __assert_fail("ntoh.hasName(\"11 elephant\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x727,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,anon_var_dwarf_1ac75,&local_231);
  bVar2 = QPDFNameTreeObjectHelper::hasName((string *)local_a8);
  if ((bVar2 & 1) == 0) {
    __assert_fail("ntoh.hasName(\"07 sev\\xe2\\x80\\xa2n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x728,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"potato",
             (allocator<char> *)
             ((long)&oh.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar2 = QPDFNameTreeObjectHelper::hasName((string *)local_a8);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!ntoh.hasName(\"potato\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x729,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&oh.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_290,"potato",&local_291);
  bVar2 = QPDFNameTreeObjectHelper::findObject((string *)local_a8,(QPDFObjectHandle *)local_290);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!ntoh.findObject(\"potato\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72b,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,anon_var_dwarf_1ac75,&local_2b9);
  bVar2 = QPDFNameTreeObjectHelper::findObject((string *)local_a8,(QPDFObjectHandle *)local_2b8);
  if ((bVar2 & 1) == 0) {
    __assert_fail("ntoh.findObject(\"07 sev\\xe2\\x80\\xa2n\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72c,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  bVar1 = std::operator==("seven!",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&last.ivalue.second.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
  if (!bVar1) {
    __assert_fail("\"seven!\" == oh.getStringValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72d,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string
            ((string *)
             &last.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::last();
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"29 twenty-nine");
  if (!bVar1) {
    __assert_fail("last->first == \"29 twenty-nine\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72f,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  bVar1 = std::operator==(&local_348,"twenty-nine!");
  if (!bVar1) {
    __assert_fail("last->second.getUTF8Value() == \"twenty-nine!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x730,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_348);
  QPDFNameTreeObjectHelper::newEmpty
            ((QPDF *)&iter1.ivalue.second.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(pdf,0));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_410);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x734,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_410);
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_3c8);
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_458);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x736,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_458);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_3c8);
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_4a0);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x738,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_508,"1",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,"1",(allocator<char> *)((long)&iter1_val + 7));
  QPDFObjectHandle::newString((string *)&local_520);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_4e8,
             (QPDFObjectHandle *)
             &iter1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_4e8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_520);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter1_val + 7));
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_3c8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"1");
  if (!bVar1) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73b,"void test_48(QPDF &, const char *)");
  }
  local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_3c8);
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_598);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73e,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_598);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_3c8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"1");
  if (!bVar1) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x740,"void test_48(QPDF &, const char *)");
  }
  bVar1 = std::operator==(local_550,"1");
  if (!bVar1) {
    __assert_fail("iter1_val.first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x741,"void test_48(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_600,"2",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"2",&local_639);
  QPDFObjectHandle::newString((string *)&local_618);
  QPDFNameTreeObjectHelper::insert
            ((string *)&local_5e0,
             (QPDFObjectHandle *)
             &iter1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_5e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_618);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator(&local_601);
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_3c8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"2");
  if (!bVar1) {
    __assert_fail("iter1->first == \"2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x744,"void test_48(QPDF &, const char *)");
  }
  bVar1 = std::operator==(local_550,"2");
  if (!bVar1) {
    __assert_fail("iter1_val.first == \"2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x745,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_3c8);
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_688);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x747,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_688);
  bVar1 = qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)(local_550 + 1));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!iter1_val.second",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x748,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_3c8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"1");
  if (!bVar1) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x74a,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_3c8);
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_3c8,&local_6d0);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x74c,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_6d0);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_3c8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"2");
  if (!bVar1) {
    __assert_fail("iter1->first == \"2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x74e,"void test_48(QPDF &, const char *)");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"insertAfter");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  QPDFNameTreeObjectHelper::newEmpty
            ((QPDF *)&iter2.ivalue.second.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(pdf,0));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  bVar2 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_750,&local_798);
  if ((bVar2 & 1) == 0) {
    __assert_fail("iter2 == new2.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x753,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7b8,"3",&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"3!",&local_7f1);
  QPDFObjectHandle::newString((string *)&local_7d0);
  QPDFNameTreeObjectHelper::iterator::insertAfter((string *)local_750,(QPDFObjectHandle *)local_7b8)
  ;
  QPDFObjectHandle::~QPDFObjectHandle(&local_7d0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"3");
  if (!bVar1) {
    __assert_fail("iter2->first == \"3\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x755,"void test_48(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"4",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_850,"4!",(allocator<char> *)((long)&__range1_2 + 7));
  QPDFObjectHandle::newString((string *)&local_830);
  QPDFNameTreeObjectHelper::iterator::insertAfter((string *)local_750,(QPDFObjectHandle *)local_818)
  ;
  QPDFObjectHandle::~QPDFObjectHandle(&local_830);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar3,"4");
  if (!bVar1) {
    __assert_fail("iter2->first == \"4\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x757,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                      ((iterator *)
                       &__end1_2.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&i);
    if (!bVar1) break;
    psVar6 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&std::cout,psVar6);
    poVar4 = std::operator<<(poVar4," ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)
                                    &empties.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &empties.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1_2.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1_2.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  __range1_3._5_1_ = 1;
  local_988 = &local_980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"/Empty1",(allocator<char> *)((long)&__range1_3 + 7));
  local_988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_960,"/Empty2",(allocator<char> *)((long)&__range1_3 + 6));
  __range1_3._5_1_ = 0;
  local_940 = &local_980;
  local_938 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1_3 + 4));
  __l._M_len = local_938;
  __l._M_array = local_940;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_930,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1_3 + 4));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1_3 + 4));
  local_19b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_940;
  do {
    local_19b0 = local_19b0 + -1;
    std::__cxx11::string::~string((string *)local_19b0);
  } while (local_19b0 != &local_980);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
  __end1_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_930);
  k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_930);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&k);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad1 -- wrong key type");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1070,"/Bad1",&local_1071);
      QPDFObjectHandle::getKey((string *)&local_1040);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_1030,(QPDFObjectHandle *)&local_1040,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1040);
      std::__cxx11::string::~string(local_1070);
      std::allocator<char>::~allocator(&local_1071);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1050);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_10e0,"G",(allocator<char> *)((long)&__range1_4 + 7));
      QPDFNameTreeObjectHelper::find((string *)&local_10c0,SUB81(local_1030,0));
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar3,"A");
      if (!bVar1) {
        __assert_fail("bad1.find(\"G\", true)->first == \"A\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x776,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_10c0);
      std::__cxx11::string::~string(local_10e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_4 + 7));
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::end();
      while( true ) {
        bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                          ((iterator *)
                           &__end1_4.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (iterator *)&i_2);
        if (!bVar1) break;
        psVar6 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
        poVar4 = std::operator<<((ostream *)&std::cout,psVar6);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        QPDFNameTreeObjectHelper::iterator::operator++
                  ((iterator *)
                   &__end1_4.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i_2);
      QPDFNameTreeObjectHelper::iterator::~iterator
                ((iterator *)
                 &__end1_4.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad2 -- invalid kid");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1200,"/Bad2",&local_1201);
      QPDFObjectHandle::getKey((string *)&local_11d0);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_11c0,(QPDFObjectHandle *)&local_11d0,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_11d0);
      std::__cxx11::string::~string(local_1200);
      std::allocator<char>::~allocator(&local_1201);
      QPDFObjectHandle::~QPDFObjectHandle(&local_11e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1270,"G",(allocator<char> *)((long)&__range1_5 + 7));
      QPDFNameTreeObjectHelper::find((string *)&local_1250,SUB81(local_11c0,0));
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar3,"B");
      if (!bVar1) {
        __assert_fail("bad2.find(\"G\", true)->first == \"B\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x77d,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_1250);
      std::__cxx11::string::~string(local_1270);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_5 + 7));
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::end();
      while( true ) {
        bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                          ((iterator *)
                           &__end1_5.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (iterator *)&i_3);
        if (!bVar1) break;
        psVar6 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
        poVar4 = std::operator<<((ostream *)&std::cout,psVar6);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        QPDFNameTreeObjectHelper::iterator::operator++
                  ((iterator *)
                   &__end1_5.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i_3);
      QPDFNameTreeObjectHelper::iterator::~iterator
                ((iterator *)
                 &__end1_5.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad3 -- invalid kid");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1390,"/Bad3",&local_1391);
      QPDFObjectHandle::getKey((string *)&local_1360);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_1350,(QPDFObjectHandle *)&local_1360,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1360);
      std::__cxx11::string::~string(local_1390);
      std::allocator<char>::~allocator(&local_1391);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1370);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1400,"G",&local_1401);
      QPDFNameTreeObjectHelper::find((string *)&local_13e0,SUB81(local_1350,0));
      QPDFNameTreeObjectHelper::end();
      bVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&local_13e0,&local_1450);
      if ((bVar2 & 1) == 0) {
        __assert_fail("bad3.find(\"G\", true) == bad3.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x784,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_1450);
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_13e0);
      std::__cxx11::string::~string(local_1400);
      std::allocator<char>::~allocator(&local_1401);
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad4 -- invalid kid");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_14c8,"/Bad4",&local_14c9);
      QPDFObjectHandle::getKey((string *)&local_1498);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_1488,(QPDFObjectHandle *)&local_1498,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1498);
      std::__cxx11::string::~string(local_14c8);
      std::allocator<char>::~allocator(&local_14c9);
      QPDFObjectHandle::~QPDFObjectHandle(&local_14a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1538,"F",(allocator<char> *)((long)&__range1_6 + 7));
      QPDFNameTreeObjectHelper::find((string *)&local_1518,SUB81(local_1488,0));
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar3,"C");
      if (!bVar1) {
        __assert_fail("bad4.find(\"F\", true)->first == \"C\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x788,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_1518);
      std::__cxx11::string::~string(local_1538);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_6 + 7));
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::end();
      while( true ) {
        bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                          ((iterator *)
                           &__end1_6.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (iterator *)&i_4);
        if (!bVar1) break;
        psVar6 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
        poVar4 = std::operator<<((ostream *)&std::cout,psVar6);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        QPDFNameTreeObjectHelper::iterator::operator++
                  ((iterator *)
                   &__end1_6.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i_4);
      QPDFNameTreeObjectHelper::iterator::~iterator
                ((iterator *)
                 &__end1_6.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad5 -- loop in find");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1658,"/Bad5",&local_1659);
      QPDFObjectHandle::getKey((string *)&local_1628);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_1618,(QPDFObjectHandle *)&local_1628,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1628);
      std::__cxx11::string::~string(local_1658);
      std::allocator<char>::~allocator(&local_1659);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1638);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_16c8,"F",&local_16c9);
      QPDFNameTreeObjectHelper::find((string *)&local_16a8,SUB81(local_1618,0));
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar3,"D");
      if (!bVar1) {
        __assert_fail("bad5.find(\"F\", true)->first == \"D\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x78f,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_16a8);
      std::__cxx11::string::~string(local_16c8);
      std::allocator<char>::~allocator(&local_16c9);
      poVar4 = std::operator<<((ostream *)&std::cout,"/Bad6 -- bad limits");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      QPDF::getTrailer();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1748,"/Bad6",&local_1749);
      QPDFObjectHandle::getKey((string *)&local_1718);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                (local_1708,(QPDFObjectHandle *)&local_1718,pdf,true);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1718);
      std::__cxx11::string::~string(local_1748);
      std::allocator<char>::~allocator(&local_1749);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1728);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_17b8,"H",&local_17b9);
      QPDFObjectHandle::newNull();
      QPDFNameTreeObjectHelper::insert((string *)&local_1798,(QPDFObjectHandle *)local_1708);
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar3,"H");
      if (!bVar1) {
        __assert_fail("bad6.insert(\"H\", QPDFObjectHandle::newNull())->first == \"H\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x793,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_1798);
      QPDFObjectHandle::~QPDFObjectHandle(&local_17d0);
      std::__cxx11::string::~string(local_17b8);
      std::allocator<char>::~allocator(&local_17b9);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1708);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1618);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1488);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1350);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_11c0);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1030);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_930);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_750);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper
                ((QPDFNameTreeObjectHelper *)
                 &iter2.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_3c8);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper
                ((QPDFNameTreeObjectHelper *)
                 &iter1.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_328);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_270);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              *)&__range1_1);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_a8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
      return;
    }
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_3);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    QPDF::getTrailer();
    QPDFObjectHandle::getKey((string *)&local_9f8);
    QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
              (local_9e8,(QPDFObjectHandle *)&local_9f8,pdf,true);
    QPDFObjectHandle::~QPDFObjectHandle(&local_9f8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a08);
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    bVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&local_a50,&local_a98);
    if ((bVar2 & 1) == 0) {
      __assert_fail("empty.begin() == empty.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x760,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_a98);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_a50);
    QPDFNameTreeObjectHelper::last();
    QPDFNameTreeObjectHelper::end();
    bVar2 = QPDFNameTreeObjectHelper::iterator::operator==
                      (&local_ae0,
                       (iterator *)
                       &i_1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((bVar2 & 1) == 0) {
      __assert_fail("empty.last() == empty.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x761,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator
              ((iterator *)
               &i_1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_ae0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b90,"five",&local_b91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_bc8,"5",&local_bc9);
    QPDFObjectHandle::newString((string *)&local_ba8);
    QPDFNameTreeObjectHelper::insert((string *)local_b70,(QPDFObjectHandle *)local_9e8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_ba8);
    std::__cxx11::string::~string(local_bc8);
    std::allocator<char>::~allocator(&local_bc9);
    std::__cxx11::string::~string(local_b90);
    std::allocator<char>::~allocator(&local_b91);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"five");
    if (!bVar1) {
      __assert_fail("i->first == \"five\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x763,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_bf0,"5");
    if (!bVar1) {
      __assert_fail("i->second.getStringValue() == \"5\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x764,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_bf0);
    QPDFNameTreeObjectHelper::begin();
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"five");
    if (!bVar1) {
      __assert_fail("empty.begin()->first == \"five\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x765,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c38);
    QPDFNameTreeObjectHelper::last();
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"five");
    if (!bVar1) {
      __assert_fail("empty.last()->first == \"five\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x766,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c80);
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_ca0,"5");
    if (!bVar1) {
      __assert_fail("empty.begin()->second.getStringValue() == \"5\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x767,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_ca0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_ce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d50,"five",&local_d51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d88,"5+",&local_d89);
    QPDFObjectHandle::newString((string *)&local_d68);
    QPDFNameTreeObjectHelper::insert((string *)&local_d30,(QPDFObjectHandle *)local_9e8);
    QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_b70,&local_d30);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_d30);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d68);
    std::__cxx11::string::~string(local_d88);
    std::allocator<char>::~allocator(&local_d89);
    std::__cxx11::string::~string(local_d50);
    std::allocator<char>::~allocator(&local_d51);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"five");
    if (!bVar1) break;
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_db0,"5+");
    if (!bVar1) {
      __assert_fail("i->second.getStringValue() == \"5+\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x76a,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_db0);
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_dd0,"5+");
    if (!bVar1) {
      __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x76b,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_dd0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_e18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e80,"six",&local_e81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_eb8,"6",&local_eb9);
    QPDFObjectHandle::newString((string *)&local_e98);
    QPDFNameTreeObjectHelper::insert((string *)&local_e60,(QPDFObjectHandle *)local_9e8);
    QPDFNameTreeObjectHelper::iterator::operator=((iterator *)local_b70,&local_e60);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_e60);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e98);
    std::__cxx11::string::~string(local_eb8);
    std::allocator<char>::~allocator(&local_eb9);
    std::__cxx11::string::~string(local_e80);
    std::allocator<char>::~allocator(&local_e81);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"six");
    if (!bVar1) {
      __assert_fail("i->first == \"six\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x76d,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_ee0,"6");
    if (!bVar1) {
      __assert_fail("i->second.getStringValue() == \"6\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x76e,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_ee0);
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_f00,"5+");
    if (!bVar1) {
      __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x76f,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_f00);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_f48);
    QPDFNameTreeObjectHelper::last();
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar3,"six");
    if (!bVar1) {
      __assert_fail("empty.last()->first == \"six\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x770,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_f90);
    QPDFNameTreeObjectHelper::last();
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar1 = std::operator==(&local_fb0,"6");
    if (!bVar1) {
      __assert_fail("empty.last()->second.getStringValue() == \"6\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x771,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_fb0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_ff8);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_b70);
    QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_9e8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_3);
  }
  __assert_fail("i->first == \"five\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x769,"void test_48(QPDF &, const char *)");
}

Assistant:

static void
test_48(QPDF& pdf, char const* arg2)
{
    // Test name tree. This test is crafted to work with
    // name-tree.pdf
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFNameTreeObjectHelper ntoh(qtest, pdf);
    for (auto& iter: ntoh) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    std::map<std::string, QPDFObjectHandle> ntoh_map = ntoh.getAsMap();
    for (auto& iter: ntoh_map) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    assert(ntoh.hasName("11 elephant"));
    assert(ntoh.hasName("07 sev\xe2\x80\xa2n"));
    assert(!ntoh.hasName("potato"));
    QPDFObjectHandle oh;
    assert(!ntoh.findObject("potato", oh));
    assert(ntoh.findObject("07 sev\xe2\x80\xa2n", oh));
    assert("seven!" == oh.getStringValue());
    auto last = ntoh.last();
    assert(last->first == "29 twenty-nine");
    assert(last->second.getUTF8Value() == "twenty-nine!");

    auto new1 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter1 = new1.begin();
    assert(iter1 == new1.end());
    ++iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1 == new1.end());
    new1.insert("1", QPDFObjectHandle::newString("1"));
    ++iter1;
    assert(iter1->first == "1");
    auto& iter1_val = *iter1;
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "1");
    assert(iter1_val.first == "1");
    new1.insert("2", QPDFObjectHandle::newString("2"));
    ++iter1;
    assert(iter1->first == "2");
    assert(iter1_val.first == "2");
    ++iter1;
    assert(iter1 == new1.end());
    assert(!iter1_val.second);
    ++iter1;
    assert(iter1->first == "1");
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "2");

    std::cout << "insertAfter" << std::endl;
    auto new2 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter2 = new2.begin();
    assert(iter2 == new2.end());
    iter2.insertAfter("3", QPDFObjectHandle::newString("3!"));
    assert(iter2->first == "3");
    iter2.insertAfter("4", QPDFObjectHandle::newString("4!"));
    assert(iter2->first == "4");
    for (auto& i: new2) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    std::vector<std::string> empties = {"/Empty1", "/Empty2"};
    for (auto const& k: empties) {
        std::cout << k << std::endl;
        auto empty = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey(k), pdf);
        assert(empty.begin() == empty.end());
        assert(empty.last() == empty.end());
        auto i = empty.insert("five", QPDFObjectHandle::newString("5"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5");
        assert(empty.begin()->first == "five");
        assert(empty.last()->first == "five");
        assert(empty.begin()->second.getStringValue() == "5");
        i = empty.insert("five", QPDFObjectHandle::newString("5+"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5+");
        assert(empty.begin()->second.getStringValue() == "5+");
        i = empty.insert("six", QPDFObjectHandle::newString("6"));
        assert(i->first == "six");
        assert(i->second.getStringValue() == "6");
        assert(empty.begin()->second.getStringValue() == "5+");
        assert(empty.last()->first == "six");
        assert(empty.last()->second.getStringValue() == "6");
    }

    std::cout << "/Bad1 -- wrong key type" << std::endl;
    auto bad1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad1"), pdf);
    assert(bad1.find("G", true)->first == "A");
    for (auto const& i: bad1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad2 -- invalid kid" << std::endl;
    auto bad2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad2"), pdf);
    assert(bad2.find("G", true)->first == "B");
    for (auto const& i: bad2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad3 -- invalid kid" << std::endl;
    auto bad3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad3"), pdf);
    assert(bad3.find("G", true) == bad3.end());

    std::cout << "/Bad4 -- invalid kid" << std::endl;
    auto bad4 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad4"), pdf);
    assert(bad4.find("F", true)->first == "C");
    for (auto const& i: bad4) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad5 -- loop in find" << std::endl;
    auto bad5 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad5"), pdf);
    assert(bad5.find("F", true)->first == "D");

    std::cout << "/Bad6 -- bad limits" << std::endl;
    auto bad6 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad6"), pdf);
    assert(bad6.insert("H", QPDFObjectHandle::newNull())->first == "H");
}